

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O0

int Acb_ObjToGia2(Gia_Man_t *pNew,int fUseBuf,Acb_Ntk_t *p,int iObj,Vec_Int_t *vTemp,int fUseXors)

{
  int iVar1;
  int iVar2;
  Acb_ObjType_t AVar3;
  int *piVar4;
  int local_94;
  int local_6c;
  int local_58;
  int Res;
  int Type;
  int k;
  int iFanin;
  int *pFanin;
  int fUseXors_local;
  Vec_Int_t *vTemp_local;
  int iObj_local;
  Acb_Ntk_t *p_local;
  int fUseBuf_local;
  Gia_Man_t *pNew_local;
  
  iVar1 = Acb_ObjIsCio(p,iObj);
  if (iVar1 != 0) {
    __assert_fail("!Acb_ObjIsCio(p, iObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbUtil.c"
                  ,0x2de,"int Acb_ObjToGia2(Gia_Man_t *, int, Acb_Ntk_t *, int, Vec_Int_t *, int)");
  }
  Vec_IntClear(vTemp);
  Res = 0;
  piVar4 = Acb_ObjFanins(p,iObj);
  for (; Res < *piVar4; Res = Res + 1) {
    iVar1 = piVar4[Res + 1];
    iVar2 = Acb_ObjCopy(p,iVar1);
    if (iVar2 < 0) {
      __assert_fail("Acb_ObjCopy(p, iFanin) >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbUtil.c"
                    ,0x2e2,"int Acb_ObjToGia2(Gia_Man_t *, int, Acb_Ntk_t *, int, Vec_Int_t *, int)"
                   );
    }
    iVar1 = Acb_ObjCopy(p,iVar1);
    Vec_IntPush(vTemp,iVar1);
  }
  AVar3 = Acb_ObjType(p,iObj);
  if (AVar3 == ABC_OPER_CONST_F) {
    pNew_local._4_4_ = 0;
  }
  else if (AVar3 == ABC_OPER_CONST_T) {
    pNew_local._4_4_ = 1;
  }
  else if ((AVar3 == ABC_OPER_BIT_BUF) || (AVar3 == ABC_OPER_BIT_INV)) {
    if (fUseBuf == 0) {
      local_6c = Vec_IntEntry(vTemp,0);
    }
    else {
      iVar1 = Vec_IntEntry(vTemp,0);
      local_6c = Gia_ManAppendBuf(pNew,iVar1);
    }
    pNew_local._4_4_ = Abc_LitNotCond(local_6c,(uint)(AVar3 == ABC_OPER_BIT_INV));
  }
  else if ((AVar3 == ABC_OPER_BIT_AND) || (AVar3 == ABC_OPER_BIT_NAND)) {
    local_58 = 1;
    for (Res = 0; iVar1 = Vec_IntSize(vTemp), Res < iVar1; Res = Res + 1) {
      iVar1 = Vec_IntEntry(vTemp,Res);
      local_58 = Gia_ManAppendAnd2(pNew,local_58,iVar1);
    }
    pNew_local._4_4_ = Abc_LitNotCond(local_58,(uint)(AVar3 == ABC_OPER_BIT_NAND));
  }
  else if ((AVar3 == ABC_OPER_BIT_OR) || (AVar3 == ABC_OPER_BIT_NOR)) {
    local_58 = 0;
    for (Res = 0; iVar1 = Vec_IntSize(vTemp), Res < iVar1; Res = Res + 1) {
      iVar1 = Vec_IntEntry(vTemp,Res);
      local_58 = Gia_ManAppendOr2(pNew,local_58,iVar1);
    }
    pNew_local._4_4_ = Abc_LitNotCond(local_58,(uint)(AVar3 == ABC_OPER_BIT_NOR));
  }
  else {
    if ((AVar3 != ABC_OPER_BIT_XOR) && (AVar3 != ABC_OPER_BIT_NXOR)) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbUtil.c"
                    ,0x304,"int Acb_ObjToGia2(Gia_Man_t *, int, Acb_Ntk_t *, int, Vec_Int_t *, int)"
                   );
    }
    local_58 = 0;
    for (Res = 0; iVar1 = Vec_IntSize(vTemp), Res < iVar1; Res = Res + 1) {
      iVar1 = Vec_IntEntry(vTemp,Res);
      if (fUseXors == 0) {
        local_94 = Gia_ManAppendXor2(pNew,local_58,iVar1);
      }
      else {
        local_94 = Gia_ManAppendXorReal2(pNew,local_58,iVar1);
      }
      local_58 = local_94;
    }
    pNew_local._4_4_ = Abc_LitNotCond(local_58,(uint)(AVar3 == ABC_OPER_BIT_NXOR));
  }
  return pNew_local._4_4_;
}

Assistant:

int Acb_ObjToGia2( Gia_Man_t * pNew, int fUseBuf, Acb_Ntk_t * p, int iObj, Vec_Int_t * vTemp, int fUseXors )
{
    //char * pName = Abc_NamStr( p->pDesign->pStrs, Acb_ObjName(p, iObj) );
    int * pFanin, iFanin, k, Type, Res;
    assert( !Acb_ObjIsCio(p, iObj) );
    Vec_IntClear( vTemp );
    Acb_ObjForEachFaninFast( p, iObj, pFanin, iFanin, k )
    {
        assert( Acb_ObjCopy(p, iFanin) >= 0 );
        Vec_IntPush( vTemp, Acb_ObjCopy(p, iFanin) );
    }
    Type = Acb_ObjType( p, iObj );
    if ( Type == ABC_OPER_CONST_F ) 
        return 0;
    if ( Type == ABC_OPER_CONST_T ) 
        return 1;
    if ( Type == ABC_OPER_BIT_BUF || Type == ABC_OPER_BIT_INV ) 
    {
        Res = fUseBuf ? Gia_ManAppendBuf(pNew, Vec_IntEntry(vTemp, 0)) : Vec_IntEntry(vTemp, 0);
        return Abc_LitNotCond( Res, Type == ABC_OPER_BIT_INV );
    }
    if ( Type == ABC_OPER_BIT_AND || Type == ABC_OPER_BIT_NAND )
    {
        Res = 1;
        Vec_IntForEachEntry( vTemp, iFanin, k )
            Res = Gia_ManAppendAnd2( pNew, Res, iFanin );
        return Abc_LitNotCond( Res, Type == ABC_OPER_BIT_NAND );
    }
    if ( Type == ABC_OPER_BIT_OR || Type == ABC_OPER_BIT_NOR )
    {
        Res = 0;
        Vec_IntForEachEntry( vTemp, iFanin, k )
            Res = Gia_ManAppendOr2( pNew, Res, iFanin );
        return Abc_LitNotCond( Res, Type == ABC_OPER_BIT_NOR );
    }
    if ( Type == ABC_OPER_BIT_XOR || Type == ABC_OPER_BIT_NXOR )
    {
        Res = 0;
        Vec_IntForEachEntry( vTemp, iFanin, k )
            Res = fUseXors ? Gia_ManAppendXorReal2(pNew, Res, iFanin) : Gia_ManAppendXor2(pNew, Res, iFanin);
        return Abc_LitNotCond( Res, Type == ABC_OPER_BIT_NXOR );
    }
    assert( 0 );
    return -1;
}